

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  CleanupNode *pCVar2;
  SerialArena *arena;
  CleanupNode *pCVar3;
  char *failure_msg;
  int line;
  CleanupNode *pCVar4;
  LogMessageFatal LStack_28;
  
  arena = GetSerialArena(this);
  pCVar1 = (arena->cleanup_list_).next_;
  if (pCVar1 < (arena->cleanup_list_).limit_) {
    (arena->cleanup_list_).next_ = pCVar1 + 1;
    pCVar1->elem = elem;
    pCVar1->destructor = cleanup;
  }
  else {
    internal::cleanup::ChunkList::AddFallback(&arena->cleanup_list_,elem,cleanup,arena);
  }
  pCVar1 = (CleanupNode *)(arena->cleanup_list_).prefetch_ptr_;
  if ((pCVar1 != (CleanupNode *)0x0) && (pCVar1 < (CleanupNode *)(arena->cleanup_list_).head_)) {
    failure_msg = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
LAB_0029441f:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  pCVar2 = (arena->cleanup_list_).next_;
  pCVar3 = pCVar1;
  if (((long)pCVar1 - (long)pCVar2 < 0x181) &&
     (pCVar4 = (arena->cleanup_list_).limit_, pCVar1 < pCVar4)) {
    pCVar3 = pCVar2;
    if (pCVar2 < pCVar1) {
      pCVar3 = pCVar1;
    }
    if (pCVar3 == (CleanupNode *)0x0) {
      failure_msg = "prefetch_ptr != nullptr";
      line = 0x122;
      goto LAB_0029441f;
    }
    if (pCVar3 + 0x18 < pCVar4) {
      pCVar4 = pCVar3 + 0x18;
    }
    for (; pCVar3 < pCVar4; pCVar3 = pCVar3 + 4) {
    }
  }
  (arena->cleanup_list_).prefetch_ptr_ = (char *)pCVar3;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}